

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-message.h
# Opt level: O3

string * __thiscall
testing::internal::StreamableToString<wchar_t*>
          (string *__return_storage_ptr__,internal *this,wchar_t **streamable)

{
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_20;
  
  Message::Message((Message *)&local_20);
  Message::operator<<((Message *)&local_20,*(wchar_t **)this);
  StringStreamToString(__return_storage_ptr__,local_20._M_head_impl);
  if (local_20._M_head_impl != (stringstream *)0x0) {
    (**(code **)(*(long *)local_20._M_head_impl + 8))();
  }
  return __return_storage_ptr__;
}

Assistant:

std::string StreamableToString(const T& streamable) {
  return (Message() << streamable).GetString();
}